

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int ly_set_rm(ly_set *set,void *node)

{
  uint local_24;
  uint i;
  void *node_local;
  ly_set *set_local;
  
  if ((set == (ly_set *)0x0) || (node == (void *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_rm");
    set_local._4_4_ = 1;
  }
  else {
    for (local_24 = 0; (local_24 < set->number && ((set->set).s[local_24] != (lys_node *)node));
        local_24 = local_24 + 1) {
    }
    if (local_24 == set->number) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_rm");
      set_local._4_4_ = 1;
    }
    else {
      set_local._4_4_ = ly_set_rm_index(set,local_24);
    }
  }
  return set_local._4_4_;
}

Assistant:

API int
ly_set_rm(struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set || !node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* get index */
    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            break;
        }
    }
    if (i == set->number) {
        /* node is not in set */
        LOGARG;
        return EXIT_FAILURE;
    }

    return ly_set_rm_index(set, i);
}